

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

void __thiscall
leveldb::DBImpl::RecoverLogFile(unsigned_long,bool,bool*,leveldb::VersionEdit*,unsigned_long*)::
LogReporter::Corruption(unsigned_long,leveldb::Status_const__
          (LogReporter *this,size_t bytes,Status *s)

{
  long lVar1;
  undefined8 uVar2;
  bool bVar3;
  char *pcVar4;
  char *pcVar5;
  uint in_ESI;
  long in_RDI;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  Status *rhs;
  Logger *info_log;
  Status in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar5 = "";
  if (*(long *)(in_RDI + 0x20) == 0) {
    pcVar5 = "(ignoring error) ";
  }
  info_log = *(Logger **)(in_RDI + 0x10);
  uVar2 = *(undefined8 *)(in_RDI + 0x18);
  rhs = (Status *)&stack0xffffffffffffffd8;
  Status::ToString_abi_cxx11_((Status *)in_stack_ffffffffffffffd8.state_);
  pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     (in_stack_ffffffffffffff78);
  Log(info_log,"%s%s: dropping %d bytes; %s",pcVar5,uVar2,(ulong)in_ESI,pcVar4);
  std::__cxx11::string::~string(in_stack_ffffffffffffff78);
  if ((*(long *)(in_RDI + 0x20) != 0) &&
     (bVar3 = Status::ok((Status *)in_stack_ffffffffffffff78), bVar3)) {
    Status::operator=((Status *)info_log,rhs);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Corruption(size_t bytes, const Status& s) override {
      Log(info_log, "%s%s: dropping %d bytes; %s",
          (this->status == nullptr ? "(ignoring error) " : ""), fname,
          static_cast<int>(bytes), s.ToString().c_str());
      if (this->status != nullptr && this->status->ok()) *this->status = s;
    }